

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmEval.cpp
# Opt level: O2

bool TestEvaluation(ExpressionContext *ctx,VmModule *module,char *resultBuf,uint resultBufSize,
                   char *errorBuf,uint errorBufSize)

{
  bool bVar1;
  InstructionVMEvalContext local_340;
  
  local_340.stackFrames.allocator = ctx->allocator;
  local_340.stackFrames.data = local_340.stackFrames.little;
  local_340.stackFrames.count = 0;
  local_340.stackFrames.max = 0x20;
  local_340.heap.functionOwner = (VmFunction *)0x0;
  local_340.heap.tag = "heap";
  local_340.heap.index = 0;
  local_340.heap.data.data = local_340.heap.data.little;
  local_340.heap.data.count = 0;
  local_340.heap.data.max = 0x80;
  local_340.heap.expired = false;
  local_340.storageSet.data = local_340.storageSet.little;
  local_340.storageSet.count = 0;
  local_340.storageSet.max = 0x20;
  local_340.hasError = false;
  local_340.globalFrame = (StackFrame *)0x0;
  local_340.printExecution = false;
  local_340.stackDepthLimit = 0x40;
  local_340.heapSize = 0;
  local_340.frameMemoryLimit = 0x2000;
  local_340.variableMemoryLimit = 0x1000;
  local_340.instruction = 0;
  local_340.instructionsLimit = 0x10000;
  local_340.emulateKnownExternals = true;
  local_340.ctx = ctx;
  local_340.errorBuf = errorBuf;
  local_340.errorBufSize = errorBufSize;
  local_340.heap.data.allocator = local_340.stackFrames.allocator;
  local_340.storageSet.allocator = local_340.stackFrames.allocator;
  local_340.allocator = local_340.stackFrames.allocator;
  bVar1 = EvaluateToBuffer(&local_340,module,resultBuf,resultBufSize);
  InstructionVMEvalContext::~InstructionVMEvalContext(&local_340);
  return bVar1;
}

Assistant:

bool TestEvaluation(ExpressionContext &ctx, VmModule *module, char *resultBuf, unsigned resultBufSize, char *errorBuf, unsigned errorBufSize)
{
	InstructionVMEvalContext evalCtx(ctx, ctx.allocator);

	evalCtx.errorBuf = errorBuf;
	evalCtx.errorBufSize = errorBufSize;

	evalCtx.emulateKnownExternals = true;

	return EvaluateToBuffer(evalCtx, module, resultBuf, resultBufSize);
}